

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::SetMessagePbInterval
          (Generator *this,Descriptor *descriptor)

{
  MessageOptions *descriptor_00;
  int iVar1;
  int iVar2;
  Descriptor *descriptor_01;
  EnumDescriptor *descriptor_02;
  string local_1d0;
  EnumDescriptor *local_1b0;
  EnumDescriptor *enum_des;
  EnumDescriptorProto proto;
  int local_130;
  int i_1;
  int i;
  string local_120;
  undefined1 local_100 [8];
  DescriptorProto message_proto;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  message_proto.options_ = (MessageOptions *)descriptor;
  DescriptorProto::DescriptorProto((DescriptorProto *)local_100);
  descriptor_00 = message_proto.options_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>
            (&local_120,this,(Descriptor *)message_proto.options_);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,(Descriptor *)descriptor_00,(DescriptorProto *)local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_130 = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count((Descriptor *)message_proto.options_);
    if (iVar1 <= local_130) break;
    descriptor_01 = Descriptor::nested_type((Descriptor *)message_proto.options_,local_130);
    SetMessagePbInterval(this,descriptor_01);
    local_130 = local_130 + 1;
  }
  proto.options_._4_4_ = 0;
  while( true ) {
    iVar1 = proto.options_._4_4_;
    iVar2 = Descriptor::enum_type_count((Descriptor *)message_proto.options_);
    if (iVar2 <= iVar1) break;
    EnumDescriptorProto::EnumDescriptorProto((EnumDescriptorProto *)&enum_des);
    descriptor_02 = Descriptor::enum_type((Descriptor *)message_proto.options_,proto.options_._4_4_)
    ;
    local_1b0 = descriptor_02;
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_1d0,this,descriptor_02);
    PrintSerializedPbInterval<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
              (this,descriptor_02,(EnumDescriptorProto *)&enum_des,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    EnumDescriptorProto::~EnumDescriptorProto((EnumDescriptorProto *)&enum_des);
    proto.options_._4_4_ = proto.options_._4_4_ + 1;
  }
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_100);
  return;
}

Assistant:

void Generator::SetMessagePbInterval(const Descriptor& descriptor) const {
  DescriptorProto message_proto;
  PrintSerializedPbInterval(descriptor, message_proto,
                            ModuleLevelDescriptorName(descriptor));

  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    SetMessagePbInterval(*descriptor.nested_type(i));
  }

  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    EnumDescriptorProto proto;
    const EnumDescriptor& enum_des = *descriptor.enum_type(i);
    PrintSerializedPbInterval(enum_des, proto,
                              ModuleLevelDescriptorName(enum_des));
  }
}